

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smart_ban.cpp
# Opt level: O0

void __thiscall
libtorrent::anon_unknown_13::smart_ban_plugin::on_piece_failed
          (smart_ban_plugin *this,piece_index_t p)

{
  bool bVar1;
  int iVar2;
  piece_picker *this_00;
  torrent_info *this_01;
  int *piVar3;
  session_interface *psVar4;
  undefined4 extraout_var;
  int local_148;
  undefined1 local_141;
  address local_140;
  enable_shared_from_this<libtorrent::(anonymous_namespace)::smart_ban_plugin> local_120;
  code *local_110;
  undefined8 local_108;
  type local_100;
  function<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&)> local_b0;
  uint local_8c;
  reference local_88;
  torrent_peer **i;
  const_iterator __end2;
  const_iterator __begin2;
  vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  *__range2;
  int local_60;
  piece_block pb;
  peer_request r;
  int local_38;
  int local_34;
  int size;
  vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  downloaders;
  smart_ban_plugin *this_local;
  piece_index_t p_local;
  
  downloaders.
  super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar1 = libtorrent::aux::torrent::is_aborted(this->m_torrent);
  if (!bVar1) {
    this_00 = libtorrent::aux::torrent::picker(this->m_torrent);
    local_34 = p.m_val;
    libtorrent::aux::piece_picker::get_downloaders
              ((vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                *)&size,this_00,p);
    this_01 = libtorrent::aux::torrent::torrent_file(this->m_torrent);
    local_38 = torrent_info::piece_size(this_01,p);
    pb.piece_index.m_val = 0x4000;
    pb.block_index = p.m_val;
    piVar3 = ::std::min<int>((int *)&pb,&local_38);
    r.piece.m_val = *piVar3;
    __range2._0_4_ = p.m_val;
    piece_block::piece_block((piece_block *)((long)&__range2 + 4),p,0);
    __end2 = ::std::
             vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ::begin((vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      *)&size);
    i = (torrent_peer **)
        ::std::
        vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
        end((vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             *)&size);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<libtorrent::aux::torrent_peer_*const_*,_std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
                                       *)&i), bVar1) {
      local_88 = __gnu_cxx::
                 __normal_iterator<libtorrent::aux::torrent_peer_*const_*,_std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
                 ::operator*(&__end2);
      if (*local_88 != (torrent_peer *)0x0) {
        psVar4 = libtorrent::aux::torrent::session(this->m_torrent);
        iVar2 = (*(psVar4->super_session_logger)._vptr_session_logger[4])();
        local_8c = (uint)libtorrent::aux::torrent::storage(this->m_torrent);
        local_110 = on_read_failed_block;
        local_108 = 0;
        ::std::enable_shared_from_this<libtorrent::(anonymous_namespace)::smart_ban_plugin>::
        shared_from_this(&local_120);
        libtorrent::aux::torrent_peer::address(&local_140,*local_88);
        ::std::
        bind<void(libtorrent::(anonymous_namespace)::smart_ban_plugin::*)(libtorrent::piece_block,boost::asio::ip::address,libtorrent::disk_buffer_holder,int,libtorrent::storage_error_const&),std::shared_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin>,libtorrent::piece_block&,boost::asio::ip::address,std::_Placeholder<1>const&,int&,std::_Placeholder<2>const&>
                  (&local_100,(offset_in_smart_ban_plugin_to_subr *)&local_110,
                   (shared_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin> *)&local_120,
                   (piece_block *)((long)&__range2 + 4),&local_140,
                   (_Placeholder<1> *)&::std::placeholders::_1,(int *)&r,
                   (_Placeholder<2> *)&::std::placeholders::_2);
        ::std::function<void(libtorrent::disk_buffer_holder,libtorrent::storage_error_const&)>::
        function<std::_Bind<void(libtorrent::(anonymous_namespace)::smart_ban_plugin::*(std::shared_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin>,libtorrent::piece_block,boost::asio::ip::address,std::_Placeholder<1>,int,std::_Placeholder<2>))(libtorrent::piece_block,boost::asio::ip::address,libtorrent::disk_buffer_holder,int,libtorrent::storage_error_const&)>,void>
                  ((function<void(libtorrent::disk_buffer_holder,libtorrent::storage_error_const&)>
                    *)&local_b0,&local_100);
        local_141 = 1;
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
                  ((long *)CONCAT44(extraout_var,iVar2),local_8c,&pb.block_index,&local_b0,1);
        ::std::function<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&)>::
        ~function(&local_b0);
        ::std::
        _Bind<void_(libtorrent::(anonymous_namespace)::smart_ban_plugin::*(std::shared_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin>,_libtorrent::piece_block,_boost::asio::ip::address,_std::_Placeholder<1>,_int,_std::_Placeholder<2>))(libtorrent::piece_block,_boost::asio::ip::address,_libtorrent::disk_buffer_holder,_int,_const_libtorrent::storage_error_&)>
        ::~_Bind(&local_100);
        ::std::shared_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin>::~shared_ptr
                  ((shared_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin> *)&local_120);
      }
      local_38 = local_38 + -0x4000;
      local_148 = 0x4000;
      piVar3 = ::std::min<int>(&local_148,&local_38);
      r.piece.m_val = *piVar3;
      local_60 = local_60 + 1;
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::torrent_peer_*const_*,_std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
      ::operator++(&__end2);
    }
    ::std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ::~vector((vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               *)&size);
  }
  return;
}

Assistant:

void on_piece_failed(piece_index_t const p) override
		{
			// The piece failed the hash check. Record
			// the CRC and origin peer of every block

			// if the torrent is aborted, no point in starting
			// a bunch of read operations on it
			if (m_torrent.is_aborted()) return;

			std::vector<aux::torrent_peer*> const downloaders
				= m_torrent.picker().get_downloaders(p);

			int size = m_torrent.torrent_file().piece_size(p);
			peer_request r = {p, 0, std::min(16*1024, size)};
			piece_block pb(p, 0);
			for (auto const& i : downloaders)
			{
				if (i != nullptr)
				{
					// for very sad and involved reasons, this read need to force a copy out of the cache
					// since the piece has failed, this block is very likely to be replaced with a newly
					// downloaded one very soon, and to get a block by reference would fail, since the
					// block read will have been deleted by the time it gets back to the network thread
					m_torrent.session().disk_thread().async_read(m_torrent.storage(), r
						, std::bind(&smart_ban_plugin::on_read_failed_block
						, shared_from_this(), pb, i->address(), _1, r.length, _2)
						, disk_interface::force_copy);
				}

				r.start += 16*1024;
				size -= 16*1024;
				r.length = std::min(16*1024, size);
				++pb.block_index;
			}
			TORRENT_ASSERT(size <= 0);
		}